

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::QUADRANGLE(ChQuaternion<double> *__return_storage_ptr__,ChQuaternion<double> *q0,
                  ChQuaternion<double> *q1,ChQuaternion<double> *q2)

{
  double dVar1;
  double dVar2;
  ChQuaternion<double> *q;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong local_30;
  undefined1 extraout_var [56];
  
  dVar8 = q1->m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar8;
  dVar1 = q1->m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1;
  auVar38._0_8_ = -dVar1;
  auVar38._8_8_ = 0x8000000000000000;
  dVar43 = q1->m_data[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar43;
  auVar42._0_8_ = -dVar43;
  auVar42._8_8_ = 0x8000000000000000;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = q1->m_data[3];
  auVar40._0_8_ = -q1->m_data[3];
  auVar40._8_8_ = 0x8000000000000000;
  dVar9 = q2->m_data[0];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar9;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = q2->m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = q2->m_data[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = q2->m_data[3];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar9 * dVar1;
  auVar3 = vfmsub231sd_fma(auVar46,auVar29,auVar6);
  auVar3 = vfmadd231sd_fma(auVar3,auVar36,auVar5);
  auVar46 = vfnmadd231sd_fma(auVar3,auVar34,auVar14);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar9 * dVar43;
  auVar3 = vfmsub231sd_fma(auVar44,auVar29,auVar5);
  auVar3 = vfnmadd231sd_fma(auVar3,auVar36,auVar6);
  auVar3 = vfmadd231sd_fma(auVar3,auVar32,auVar14);
  dVar9 = auVar3._0_8_;
  auVar3 = vmulsd_avx512f(auVar45,auVar36);
  auVar3 = vfmsub231sd_avx512f(auVar3,auVar29,auVar14);
  auVar3 = vfmadd231sd_avx512f(auVar3,auVar34,auVar6);
  auVar4 = vfnmadd231sd_avx512f(auVar3,auVar32,auVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar9 * dVar9;
  auVar3 = vfmadd231sd_fma(auVar3,auVar46,auVar46);
  auVar3 = vfmadd231sd_avx512f(auVar3,auVar4,auVar4);
  auVar26 = ZEXT816(0x4000000000000000);
  dVar43 = auVar3._0_8_;
  if (1e-30 < dVar43) {
    vmovsd_avx512f(auVar4);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar1 * q2->m_data[1];
    auVar4 = vfmadd213sd_fma(auVar45,auVar29,auVar22);
    auVar4 = vfmadd213sd_fma(auVar5,auVar34,auVar4);
    auVar4 = vfmadd213sd_fma(auVar14,auVar36,auVar4);
    if (dVar43 < 0.0) {
      dVar43 = sqrt(dVar43);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar3,auVar3);
      dVar43 = auVar3._0_8_;
    }
    dVar7 = atan2(dVar43,auVar4._0_8_);
    auVar26._0_8_ = (dVar7 + dVar7) / dVar43;
    auVar26._8_8_ = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_30;
  }
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar8;
  dVar43 = 2.0;
  auVar5 = vmulsd_avx512f(auVar4,auVar26);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = q0->m_data[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = q0->m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = q0->m_data[3];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = q0->m_data[0];
  auVar3 = vmulsd_avx512f(auVar47,auVar38);
  auVar3 = vfmadd231sd_fma(auVar3,auVar30,auVar23);
  auVar3 = vfmadd231sd_fma(auVar3,auVar36,auVar19);
  auVar3 = vfmadd231sd_fma(auVar3,auVar42,auVar15);
  auVar4 = vmulsd_avx512f(auVar47,auVar42);
  auVar4 = vfmadd231sd_fma(auVar4,auVar30,auVar19);
  auVar4 = vfmadd231sd_fma(auVar4,auVar40,auVar23);
  auVar4 = vfmadd231sd_fma(auVar4,auVar32,auVar15);
  dVar7 = auVar4._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = q0->m_data[0];
  auVar4 = vmulsd_avx512f(auVar48,auVar40);
  auVar4 = vfmadd231sd_fma(auVar4,auVar30,auVar15);
  auVar4 = vfmadd231sd_fma(auVar4,auVar34,auVar23);
  auVar4 = vfmadd231sd_fma(auVar4,auVar19,auVar38);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7 * dVar7;
  auVar14 = vfmadd231sd_fma(auVar10,auVar3,auVar3);
  auVar14 = vfmadd231sd_fma(auVar14,auVar4,auVar4);
  dVar8 = auVar14._0_8_;
  if (1e-30 < dVar8) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar1 * q0->m_data[1];
    auVar6 = vfmadd213sd_avx512f(auVar48,auVar30,auVar24);
    auVar6 = vfmadd213sd_avx512f(auVar19,auVar34,auVar6);
    auVar6 = vfmadd213sd_fma(auVar15,auVar36,auVar6);
    if (dVar8 < 0.0) {
      dVar43 = sqrt(dVar8);
    }
    else {
      auVar14 = vsqrtsd_avx(auVar14,auVar14);
      dVar43 = auVar14._0_8_;
    }
    dVar8 = atan2(dVar43,auVar6._0_8_);
    dVar43 = (dVar8 + dVar8) / dVar43;
  }
  dVar2 = (auVar46._0_8_ * auVar26._0_8_ + auVar3._0_8_ * dVar43) * -0.25;
  dVar8 = (dVar9 * auVar26._0_8_ + dVar7 * dVar43) * -0.25;
  dVar1 = (auVar5._0_8_ + auVar4._0_8_ * dVar43) * -0.25;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar8 * dVar8;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar2;
  auVar3 = vfmadd231sd_fma(auVar11,auVar27,auVar27);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar3 = vfmadd231sd_fma(auVar3,auVar16,auVar16);
  dVar43 = auVar3._0_8_;
  if (dVar43 <= 1e-30) {
    dVar43 = 0.5;
    auVar3 = ZEXT816(0x3ff0000000000000);
  }
  else {
    if (dVar43 < 0.0) {
      dVar9 = sqrt(dVar43);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar3,auVar3);
      dVar9 = auVar3._0_8_;
    }
    dVar43 = sin(dVar9 * 0.5);
    dVar43 = dVar43 / dVar9;
    auVar13._0_8_ = cos(dVar9 * 0.5);
    auVar13._8_56_ = extraout_var;
    auVar3 = auVar13._0_16_;
  }
  dVar1 = dVar1 * dVar43;
  dVar2 = dVar2 * dVar43;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = q1->m_data[0];
  dVar9 = q1->m_data[1];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar9;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar2 * dVar9;
  auVar46 = vfmsub231sd_fma(auVar33,auVar28,auVar3);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = q1->m_data[2];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar8 * dVar43;
  auVar46 = vfnmadd231sd_fma(auVar46,auVar35,auVar20);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = q1->m_data[3];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar4 = vfnmadd231sd_fma(auVar46,auVar37,auVar17);
  dVar7 = auVar3._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar7 * dVar9;
  auVar3 = vfmadd231sd_fma(auVar39,auVar28,auVar25);
  auVar3 = vfnmadd231sd_fma(auVar3,auVar37,auVar20);
  auVar3 = vfmadd231sd_fma(auVar3,auVar35,auVar17);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar8 * dVar43;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar7 * q1->m_data[2];
  auVar46 = vfmadd231sd_fma(auVar41,auVar28,auVar21);
  auVar46 = vfmadd231sd_fma(auVar46,auVar37,auVar25);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar14 = vfnmadd231sd_fma(auVar46,auVar31,auVar18);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = q1->m_data[3] * dVar7;
  auVar46 = vfmadd231sd_fma(auVar12,auVar28,auVar18);
  auVar46 = vfnmadd231sd_fma(auVar46,auVar35,auVar25);
  auVar46 = vfmadd231sd_fma(auVar46,auVar31,auVar21);
  __return_storage_ptr__->m_data[0] = auVar4._0_8_;
  __return_storage_ptr__->m_data[1] = auVar3._0_8_;
  __return_storage_ptr__->m_data[2] = auVar14._0_8_;
  __return_storage_ptr__->m_data[3] = auVar46._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> QUADRANGLE(const ChQuaternion<>& q0, const ChQuaternion<>& q1, const ChQuaternion<>& q2) {
       
	ChQuaternion<> qInv = q1.GetConjugate();

	ChQuaternion<> sq1 = qInv * q2;
        
	ChVector<> cart0 = sq1.Q_to_Rotv(); 
 
	ChQuaternion<> sq0 = qInv * q0;

	ChVector<> cart1 = sq0.Q_to_Rotv();

	ChVector<> cart_aux = (cart0 + cart1) * -0.25;

	ChQuaternion<> q_aux; q_aux.Q_from_Rotv(cart_aux);

	return q1 * q_aux; 
 }